

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_ssse3.c
# Opt level: O0

void calculate_dqcoeff_and_store_64x64
               (__m128i qcoeff,__m128i dequant,__m128i zero,tran_low_t *dqcoeff)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 local_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  __m128i dqcoeff32_1;
  __m128i dqcoeff32_0;
  __m128i high;
  __m128i low;
  __m128i sign_1;
  __m128i sign_0;
  __m128i coeff;
  tran_low_t *dqcoeff_local;
  
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = in_XMM0_Qa;
  auVar5 = pabsw(auVar5,auVar5);
  local_d8 = (undefined2)in_XMM2_Qa;
  uStack_d6 = (undefined2)((ulong)in_XMM2_Qa >> 0x10);
  uStack_d4 = (undefined2)((ulong)in_XMM2_Qa >> 0x20);
  uStack_d2 = (undefined2)((ulong)in_XMM2_Qa >> 0x30);
  local_e8 = (undefined2)in_XMM0_Qa;
  uStack_e6 = (undefined2)((ulong)in_XMM0_Qa >> 0x10);
  uStack_e4 = (undefined2)((ulong)in_XMM0_Qa >> 0x20);
  uStack_e2 = (undefined2)((ulong)in_XMM0_Qa >> 0x30);
  uStack_90 = (undefined2)in_XMM2_Qb;
  uStack_8e = (undefined2)((ulong)in_XMM2_Qb >> 0x10);
  uStack_8c = (undefined2)((ulong)in_XMM2_Qb >> 0x20);
  uStack_8a = (undefined2)((ulong)in_XMM2_Qb >> 0x30);
  uStack_a0 = (undefined2)in_XMM0_Qb;
  uStack_9e = (undefined2)((ulong)in_XMM0_Qb >> 0x10);
  uStack_9c = (undefined2)((ulong)in_XMM0_Qb >> 0x20);
  uStack_9a = (undefined2)((ulong)in_XMM0_Qb >> 0x30);
  local_118 = auVar5._0_2_;
  uStack_116 = auVar5._2_2_;
  uStack_114 = auVar5._4_2_;
  uStack_112 = auVar5._6_2_;
  uStack_110 = auVar5._8_2_;
  uStack_10e = auVar5._10_2_;
  uStack_10c = auVar5._12_2_;
  uStack_10a = auVar5._14_2_;
  local_128 = (short)in_XMM1_Qa;
  uStack_126 = (short)((ulong)in_XMM1_Qa >> 0x10);
  uStack_124 = (short)((ulong)in_XMM1_Qa >> 0x20);
  uStack_122 = (short)((ulong)in_XMM1_Qa >> 0x30);
  uStack_120 = (short)in_XMM1_Qb;
  uStack_11e = (short)((ulong)in_XMM1_Qb >> 0x10);
  uStack_11c = (short)((ulong)in_XMM1_Qb >> 0x20);
  uStack_11a = (short)((ulong)in_XMM1_Qb >> 0x30);
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = in_XMM1_Qa;
  auVar5 = pmulhw(auVar5,auVar6);
  local_108 = auVar5._0_2_;
  uStack_106 = auVar5._2_2_;
  uStack_104 = auVar5._4_2_;
  uStack_102 = auVar5._6_2_;
  local_238._0_4_ = CONCAT22(local_108,local_118 * local_128);
  local_238._0_6_ = CONCAT24(uStack_116 * uStack_126,(uint)local_238);
  local_238 = CONCAT26(uStack_106,(undefined6)local_238);
  uStack_230._0_2_ = uStack_114 * uStack_124;
  uStack_230._2_2_ = uStack_104;
  uStack_230._4_2_ = uStack_112 * uStack_122;
  uStack_230._6_2_ = uStack_102;
  uStack_c0 = auVar5._8_2_;
  uStack_be = auVar5._10_2_;
  uStack_bc = auVar5._12_2_;
  uStack_ba = auVar5._14_2_;
  local_248._0_4_ = CONCAT22(uStack_c0,uStack_110 * uStack_120);
  local_248._0_6_ = CONCAT24(uStack_10e * uStack_11e,(uint)local_248);
  local_248 = CONCAT26(uStack_be,(undefined6)local_248);
  uStack_240._0_2_ = uStack_10c * uStack_11c;
  uStack_240._2_2_ = uStack_bc;
  uStack_240._4_2_ = uStack_10a * uStack_11a;
  uStack_240._6_2_ = uStack_ba;
  low[0]._0_4_ = local_238._8_4_;
  low[0]._4_4_ = local_238._12_4_;
  local_238 = CONCAT44((uint)((ulong)local_238 >> 0x22),(uint)local_238 >> 2);
  uStack_230._0_4_ = (uint)low[0] >> 2;
  uStack_230._4_4_ = low[0]._4_4_ >> 2;
  dqcoeff32_0[0]._0_4_ = local_248._8_4_;
  dqcoeff32_0[0]._4_4_ = local_248._12_4_;
  local_248 = CONCAT44((uint)((ulong)local_248 >> 0x22),(uint)local_248 >> 2);
  uStack_240._0_4_ = (uint)dqcoeff32_0[0] >> 2;
  uStack_240._4_4_ = dqcoeff32_0[0]._4_4_ >> 2;
  auVar3._2_2_ = local_e8;
  auVar3._0_2_ = local_d8;
  auVar3._4_2_ = uStack_d6;
  auVar3._6_2_ = uStack_e6;
  auVar3._10_2_ = uStack_e4;
  auVar3._8_2_ = uStack_d4;
  auVar3._12_2_ = uStack_d2;
  auVar3._14_2_ = uStack_e2;
  auVar4._8_8_ = uStack_230;
  auVar4._0_8_ = local_238;
  auVar5 = psignd(auVar4,auVar3);
  auVar1._2_2_ = uStack_a0;
  auVar1._0_2_ = uStack_90;
  auVar1._4_2_ = uStack_8e;
  auVar1._6_2_ = uStack_9e;
  auVar1._10_2_ = uStack_9c;
  auVar1._8_2_ = uStack_8c;
  auVar1._12_2_ = uStack_8a;
  auVar1._14_2_ = uStack_9a;
  auVar2._8_8_ = uStack_240;
  auVar2._0_8_ = local_248;
  auVar6 = psignd(auVar2,auVar1);
  local_238 = auVar5._0_8_;
  uStack_230 = auVar5._8_8_;
  *(undefined8 *)qcoeff[0] = local_238;
  *(undefined8 *)(qcoeff[0] + 8) = uStack_230;
  local_248 = auVar6._0_8_;
  uStack_240 = auVar6._8_8_;
  *(undefined8 *)(qcoeff[0] + 0x10) = local_248;
  *(undefined8 *)(qcoeff[0] + 0x18) = uStack_240;
  return;
}

Assistant:

static inline void calculate_dqcoeff_and_store_64x64(const __m128i qcoeff,
                                                     const __m128i dequant,
                                                     const __m128i zero,
                                                     tran_low_t *dqcoeff) {
  // Un-sign to bias rounding like C.
  const __m128i coeff = _mm_abs_epi16(qcoeff);

  const __m128i sign_0 = _mm_unpacklo_epi16(zero, qcoeff);
  const __m128i sign_1 = _mm_unpackhi_epi16(zero, qcoeff);

  const __m128i low = _mm_mullo_epi16(coeff, dequant);
  const __m128i high = _mm_mulhi_epi16(coeff, dequant);
  __m128i dqcoeff32_0 = _mm_unpacklo_epi16(low, high);
  __m128i dqcoeff32_1 = _mm_unpackhi_epi16(low, high);

  // "Divide" by 4.
  dqcoeff32_0 = _mm_srli_epi32(dqcoeff32_0, 2);
  dqcoeff32_1 = _mm_srli_epi32(dqcoeff32_1, 2);

  dqcoeff32_0 = _mm_sign_epi32(dqcoeff32_0, sign_0);
  dqcoeff32_1 = _mm_sign_epi32(dqcoeff32_1, sign_1);

  _mm_store_si128((__m128i *)(dqcoeff), dqcoeff32_0);
  _mm_store_si128((__m128i *)(dqcoeff + 4), dqcoeff32_1);
}